

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O0

void __thiscall
kratos::DependencyVisitor::visit_module_instantiation
          (DependencyVisitor *this,ModuleInstantiationStmt *stmt)

{
  bool bVar1;
  unordered_set<kratos::AssignStmt_*,_std::hash<kratos::AssignStmt_*>,_std::equal_to<kratos::AssignStmt_*>,_std::allocator<kratos::AssignStmt_*>_>
  *puVar2;
  reference ppAVar3;
  AssignStmt **assign;
  iterator __end2;
  iterator __begin2;
  unordered_set<kratos::AssignStmt_*,_std::hash<kratos::AssignStmt_*>,_std::equal_to<kratos::AssignStmt_*>,_std::allocator<kratos::AssignStmt_*>_>
  *__range2;
  unordered_set<kratos::AssignStmt_*,_std::hash<kratos::AssignStmt_*>,_std::equal_to<kratos::AssignStmt_*>,_std::allocator<kratos::AssignStmt_*>_>
  connection_stmts;
  ModuleInstantiationStmt *stmt_local;
  DependencyVisitor *this_local;
  
  connection_stmts._M_h._M_single_bucket = (__node_base_ptr)stmt;
  puVar2 = InstantiationStmt::connection_stmt(&stmt->super_InstantiationStmt);
  std::
  unordered_set<kratos::AssignStmt_*,_std::hash<kratos::AssignStmt_*>,_std::equal_to<kratos::AssignStmt_*>,_std::allocator<kratos::AssignStmt_*>_>
  ::unordered_set((unordered_set<kratos::AssignStmt_*,_std::hash<kratos::AssignStmt_*>,_std::equal_to<kratos::AssignStmt_*>,_std::allocator<kratos::AssignStmt_*>_>
                   *)&__range2,puVar2);
  __end2 = std::
           unordered_set<kratos::AssignStmt_*,_std::hash<kratos::AssignStmt_*>,_std::equal_to<kratos::AssignStmt_*>,_std::allocator<kratos::AssignStmt_*>_>
           ::begin((unordered_set<kratos::AssignStmt_*,_std::hash<kratos::AssignStmt_*>,_std::equal_to<kratos::AssignStmt_*>,_std::allocator<kratos::AssignStmt_*>_>
                    *)&__range2);
  assign = (AssignStmt **)
           std::
           unordered_set<kratos::AssignStmt_*,_std::hash<kratos::AssignStmt_*>,_std::equal_to<kratos::AssignStmt_*>,_std::allocator<kratos::AssignStmt_*>_>
           ::end((unordered_set<kratos::AssignStmt_*,_std::hash<kratos::AssignStmt_*>,_std::equal_to<kratos::AssignStmt_*>,_std::allocator<kratos::AssignStmt_*>_>
                  *)&__range2);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.super__Node_iterator_base<kratos::AssignStmt_*,_false>,
                       (_Node_iterator_base<kratos::AssignStmt_*,_false> *)&assign);
    if (!bVar1) break;
    ppAVar3 = std::__detail::_Node_iterator<kratos::AssignStmt_*,_true,_false>::operator*(&__end2);
    visit_assign(this,*ppAVar3);
    std::__detail::_Node_iterator<kratos::AssignStmt_*,_true,_false>::operator++(&__end2);
  }
  std::
  unordered_set<kratos::AssignStmt_*,_std::hash<kratos::AssignStmt_*>,_std::equal_to<kratos::AssignStmt_*>,_std::allocator<kratos::AssignStmt_*>_>
  ::~unordered_set((unordered_set<kratos::AssignStmt_*,_std::hash<kratos::AssignStmt_*>,_std::equal_to<kratos::AssignStmt_*>,_std::allocator<kratos::AssignStmt_*>_>
                    *)&__range2);
  return;
}

Assistant:

void visit_module_instantiation(ModuleInstantiationStmt *stmt) {
        auto connection_stmts = stmt->connection_stmt();
        for (auto const &assign : connection_stmts) {
            visit_assign(assign);
        }
    }